

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STLExtras.h
# Opt level: O3

type __thiscall
llvm::make_unique<llbuild::buildsystem::Target,std::__cxx11::string&>
          (llvm *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args)

{
  pointer pcVar1;
  string *psVar2;
  long *local_40;
  long local_38;
  long local_30 [2];
  
  psVar2 = (string *)operator_new(0x38);
  pcVar1 = (args->_M_dataplus)._M_p;
  local_40 = local_30;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_40,pcVar1,pcVar1 + args->_M_string_length);
  *(string **)psVar2 = psVar2 + 0x10;
  std::__cxx11::string::_M_construct<char*>(psVar2,local_40,local_38 + (long)local_40);
  *(undefined8 *)(psVar2 + 0x20) = 0;
  *(undefined8 *)(psVar2 + 0x28) = 0;
  *(undefined8 *)(psVar2 + 0x30) = 0;
  *(string **)this = psVar2;
  if (local_40 != local_30) {
    operator_delete(local_40,local_30[0] + 1);
  }
  return (__uniq_ptr_data<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>,_true,_true>
          )(__uniq_ptr_data<llbuild::buildsystem::Target,_std::default_delete<llbuild::buildsystem::Target>,_true,_true>
            )this;
}

Assistant:

typename std::enable_if<!std::is_array<T>::value, std::unique_ptr<T>>::type
make_unique(Args &&... args) {
  return std::unique_ptr<T>(new T(std::forward<Args>(args)...));
}